

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValid_TargetAndRealAndFakeTrainingInputs(void)

{
  NetworkUpdateParameters *pNVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  string *value;
  ostream *poVar6;
  Result local_198;
  ArrayFeatureType *local_170;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInput;
  ArrayFeatureType *pAStack_158;
  int i;
  ArrayFeatureType *fakeModelInputShape;
  FeatureDescription *fakeModelInput;
  _Rb_tree_node_base _Stack_140;
  size_t sStack_120;
  set<long,_std::less<long>,_std::allocator<long>_> local_118;
  set<long,_std::less<long>,_std::allocator<long>_> local_e8;
  CategoricalCrossEntropyLossLayer *local_b8;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [8];
  Result res;
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_75a77;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_75a8e;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)((long)&res.m_message.field_2 + 8),true,
             (TensorAttributes *)&tensorAttributesOut.dimension,(TensorAttributes *)&neuralNet,0x400
             ,false,false);
  CoreML::Specification::Model::set_specificationversion
            ((Model *)((long)&res.m_message.field_2 + 8),4);
  updateParams = (NetworkUpdateParameters *)
                 CoreML::Specification::Model::mutable_neuralnetwork
                           ((Model *)((long)&res.m_message.field_2 + 8));
  addSoftmaxLayer((Model *)((long)&res.m_message.field_2 + 8),"softmax","OutTensor","softmax_out");
  lossLayer = (LossLayer *)
              CoreML::Specification::NeuralNetwork::mutable_updateparams
                        ((NeuralNetwork *)updateParams);
  ceLossLayer = (CategoricalCrossEntropyLossLayer *)
                CoreML::Specification::NetworkUpdateParameters::add_losslayers
                          ((NetworkUpdateParameters *)lossLayer);
  CoreML::Specification::LossLayer::set_name((LossLayer *)ceLossLayer,"cross_entropy_loss_layer");
  local_b8 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                       ((LossLayer *)ceLossLayer);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(local_b8,"softmax_out");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(local_b8,"target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)updateParams,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = updateParams;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_e8._M_t._M_impl._0_8_ = 0;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_e8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,kSgdOptimizer,10,5,100,&local_e8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_e8);
  pNVar1 = updateParams;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_118._M_t._M_impl._0_8_ = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_118);
  addEpochs<CoreML::Specification::NeuralNetwork>((NeuralNetwork *)pNVar1,100,1,100,&local_118);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_118);
  pNVar1 = updateParams;
  _Stack_140._M_right = (_Base_ptr)0x0;
  sStack_120 = 0;
  _Stack_140._M_parent = (_Base_ptr)0x0;
  _Stack_140._M_left = (_Base_ptr)0x0;
  fakeModelInput = (FeatureDescription *)0x0;
  _Stack_140._M_color = _S_red;
  _Stack_140._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)pNVar1,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
  fakeModelInputShape =
       (ArrayFeatureType *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)fakeModelInputShape,"madeUpInput");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)fakeModelInputShape);
  pAStack_158 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAStack_158,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (trainingInput._4_4_ = 0; trainingInput._4_4_ < 3;
      trainingInput._4_4_ = trainingInput._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAStack_158,1);
  }
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
  this = (ArrayFeatureType *)
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  trainingInputTensorShape = this;
  value = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(local_b8);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)this,value);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)trainingInputTensorShape);
  local_170 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (local_170,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape(local_170,1);
  CoreML::Model::validate(&local_198,(Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::operator=((Result *)local_68,&local_198);
  CoreML::Result::~Result(&local_198);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7df);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  spec._oneof_case_[0]._1_3_ = 0;
  spec._oneof_case_[0]._0_1_ = !bVar2;
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)((long)&res.m_message.field_2 + 8));
  return spec._oneof_case_[0];
}

Assistant:

int testValid_TargetAndRealAndFakeTrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("softmax_out");
    ceLossLayer->set_target("target");

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Difference between this and testInvalid_TargetAndFakeModelInputs is that we aren't clearing the model's actual inputs from the training inputs before adding the target, so this should instead be valid.
    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}